

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O2

void imm_idx12_x_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  ulong in_RAX;
  long lVar2;
  int iVar3;
  uint8_t extraout_DL;
  uint8_t extraout_DL_00;
  uint8_t default_size;
  cs_m680x_op *op;
  uint16_t imm16;
  undefined8 uStack_28;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  uStack_28 = in_RAX;
  indexed12_hdlr(MI,info,address);
  op->type = M680X_OP_IMMEDIATE;
  if (info->insn == M680X_INS_MOVW) {
    uStack_28 = uStack_28 & 0xffffffffffff;
    read_word(info,(uint16_t *)((long)&uStack_28 + 6),*address);
    *(int *)&(info->m680x).operands[bVar1].field_1 = (int)uStack_28._6_2_;
    (info->m680x).operands[bVar1].size = '\x02';
    default_size = extraout_DL_00;
  }
  else {
    lVar2 = (ulong)*address - (ulong)info->offset;
    iVar3 = 0;
    if ((uint)lVar2 < info->size) {
      iVar3 = (int)(char)info->code[lVar2];
    }
    (info->m680x).operands[bVar1].field_1.imm = iVar3;
    (info->m680x).operands[bVar1].size = '\x01';
    default_size = extraout_DL;
  }
  set_operand_size(info,op,default_size);
  return;
}

Assistant:

static void imm_idx12_x_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	indexed12_hdlr(MI, info, address);
	op->type = M680X_OP_IMMEDIATE;

	if (info->insn == M680X_INS_MOVW) {
		uint16_t imm16 = 0;

		read_word(info, &imm16, *address);
		op->imm = (int16_t)imm16;
		op->size = 2;
	}
	else {
		uint8_t imm8 = 0;

		read_byte(info, &imm8, *address);
		op->imm = (int8_t)imm8;
		op->size = 1;
	}

	set_operand_size(info, op, 1);
}